

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

void __thiscall LiteralTokenizerRule::~LiteralTokenizerRule(LiteralTokenizerRule *this)

{
  LiteralTokenizerRule *this_local;
  
  ~LiteralTokenizerRule(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~LiteralTokenizerRule() = default;